

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O3

uint32_t *
createDFDUnpacked(int bigEndian,int numChannels,int bytes,int redBlueSwap,VkSuffix suffix)

{
  size_t sVar1;
  uint32_t *DFD;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int offset;
  int iVar5;
  uint uVar6;
  int iVar7;
  int local_64;
  
  uVar3 = bytes * numChannels;
  uVar4 = (uint)(suffix == s_SRGB) * 0x10000 + 0x10101;
  if (bigEndian == 0) {
    sVar1 = (long)(numChannels * 4) * 4 + 0x1c;
    DFD = (uint32_t *)malloc(sVar1);
    *DFD = (uint32_t)sVar1;
    iVar5 = 0;
    DFD[1] = 0;
    DFD[2] = numChannels * 0x100000 + 0x180002;
    DFD[3] = uVar4;
    DFD[4] = 0;
    DFD[5] = uVar3;
    DFD[6] = 0;
    if (0 < numChannels) {
      uVar6 = 0;
      do {
        uVar2 = uVar6 ^ 2;
        if ((uVar6 & 0x7ffffffd) != 0) {
          uVar2 = uVar6;
        }
        if (redBlueSwap == 0) {
          uVar2 = uVar6;
        }
        writeSample(DFD,uVar6,uVar2,bytes * 8,iVar5,1,1,suffix);
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + bytes * 8;
      } while (numChannels != uVar6);
    }
  }
  else {
    sVar1 = (long)(int)(uVar3 * 4) * 4 + 0x1c;
    DFD = (uint32_t *)malloc(sVar1);
    *DFD = (uint32_t)sVar1;
    iVar5 = 0;
    DFD[1] = 0;
    DFD[2] = uVar3 * 0x100000 + 0x180002;
    DFD[3] = uVar4;
    DFD[4] = 0;
    DFD[5] = uVar3;
    DFD[6] = 0;
    if (0 < numChannels) {
      local_64 = bytes * 8 + -8;
      uVar6 = 0;
      do {
        uVar2 = uVar6 ^ 2;
        if ((uVar6 & 0x7ffffffd) != 0) {
          uVar2 = uVar6;
        }
        if (redBlueSwap == 0) {
          uVar2 = uVar6;
        }
        if (0 < bytes) {
          iVar7 = 0;
          offset = local_64;
          do {
            writeSample(DFD,iVar5 + iVar7,uVar2,8,offset,(uint)(iVar7 - bytes == -1),
                        (uint)(iVar7 == 0),suffix);
            iVar7 = iVar7 + 1;
            offset = offset + -8;
          } while (iVar7 != bytes);
        }
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + bytes;
        local_64 = local_64 + bytes * 8;
      } while (uVar6 != numChannels);
    }
  }
  return DFD;
}

Assistant:

uint32_t *createDFDUnpacked(int bigEndian, int numChannels, int bytes,
                            int redBlueSwap, enum VkSuffix suffix)
{
    uint32_t *DFD;
    if (bigEndian) {
        int channelCounter, channelByte;
        /* Number of samples = number of channels * bytes per channel */
        DFD = writeHeader(numChannels * bytes, numChannels * bytes, suffix, i_COLOR);
        /* First loop over the channels */
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            int channel = channelCounter;
            if (redBlueSwap && (channel == 0 || channel == 2)) {
                channel ^= 2;
            }
            /* Loop over the bytes that constitute a channel */
            for (channelByte = 0; channelByte < bytes; ++channelByte) {
                writeSample(DFD, channelCounter * bytes + channelByte, channel,
                            8, 8 * (channelCounter * bytes + bytes - channelByte - 1),
                            channelByte == bytes-1, channelByte == 0, suffix);
            }
        }

    } else { /* Little-endian */

        int sampleCounter;
        /* One sample per channel */
        DFD = writeHeader(numChannels, numChannels * bytes, suffix, i_COLOR);
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            int channel = sampleCounter;
            if (redBlueSwap && (channel == 0 || channel == 2)) {
                channel ^= 2;
            }
            writeSample(DFD, sampleCounter, channel,
                        8 * bytes, 8 * sampleCounter * bytes,
                        1, 1, suffix);
        }
    }
    return DFD;
}